

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShellIntrinsics.cpp
# Opt level: O0

IntrinsicResult intrinsic_getcwd(Context *context,IntrinsicResult *partialResult)

{
  String local_448;
  Value local_438;
  char local_428 [8];
  char buf [1024];
  IntrinsicResult *partialResult_local;
  Context *context_local;
  
  getcwd(local_428,0x400);
  MiniScript::String::String(&local_448,local_428);
  MiniScript::Value::Value(&local_438,&local_448);
  MiniScript::IntrinsicResult::IntrinsicResult((IntrinsicResult *)context,&local_438,true);
  MiniScript::Value::~Value(&local_438);
  MiniScript::String::~String(&local_448);
  return (IntrinsicResult)(IntrinsicResultStorage *)context;
}

Assistant:

static IntrinsicResult intrinsic_getcwd(Context *context, IntrinsicResult partialResult) {
	char buf[1024];
	getcwd(buf, sizeof(buf));
	return IntrinsicResult(String(buf));
}